

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)18>_> *
vkt::pipeline::anon_unknown_0::makeGraphicsPipeline
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkPipeline basePipeline,VkPipelineLayout pipelineLayout,
          VkRenderPass renderPass,VkShaderModule vertexModule,VkShaderModule fragmentModule,
          IVec2 *renderSize,VkPrimitiveTopology topology,deUint32 subpass,bool useDepth,
          bool useStencil)

{
  VkDevice device_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  deUint32 width;
  deUint32 height;
  VkPipelineCache local_390;
  undefined1 local_388 [8];
  VkGraphicsPipelineCreateInfo graphicsPipelineInfo;
  undefined4 local_2e8;
  VkPipelineCreateFlags flags;
  VkPipelineShaderStageCreateInfo pShaderStages [2];
  VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  VkColorComponentFlags colorComponentsAll;
  VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo;
  deUint32 dStack_1b8;
  VkStencilOpState stencilOpState;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  VkRect2D scissor;
  VkViewport viewport;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  undefined8 local_60;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  bool useStencil_local;
  bool useDepth_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VkShaderModule fragmentModule_local;
  VkShaderModule vertexModule_local;
  VkRenderPass renderPass_local;
  VkPipelineLayout pipelineLayout_local;
  VkPipeline basePipeline_local;
  
  vertexInputBindingDescription.stride._3_1_ = useDepth;
  vertexInputBindingDescription.stride._2_1_ = useStencil;
  local_60 = 0x2000000000;
  vertexInputBindingDescription.binding = 0;
  vertexInputStateInfo.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  pipelineInputAssemblyStateInfo.primitiveRestartEnable = 0x13;
  vertexInputStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexInputStateInfo._4_4_ = 0;
  vertexInputStateInfo.pNext._0_4_ = 0;
  vertexInputStateInfo.pNext._4_4_ = 1;
  vertexInputStateInfo._16_8_ = &local_60;
  vertexInputStateInfo.pVertexBindingDescriptions._0_4_ = 2;
  vertexInputStateInfo._32_8_ = &vertexInputStateInfo.pVertexAttributeDescriptions;
  unique0x10000389 = device;
  pipelineLayout_local.m_internal = basePipeline.m_internal;
  memset(&viewport.minDepth,0,0x20);
  viewport.minDepth = 2.8026e-44;
  pipelineInputAssemblyStateInfo.pNext._4_4_ = topology;
  iVar2 = tcu::Vector<int,_2>::x(renderSize);
  iVar3 = tcu::Vector<int,_2>::y(renderSize);
  ::vk::makeViewport((VkViewport *)&scissor.extent,0.0,0.0,(float)iVar2,(float)iVar3,0.0,1.0);
  pipelineViewportStateInfo.pScissors = (VkRect2D *)::vk::makeOffset2D(0,0);
  width = tcu::Vector<int,_2>::x(renderSize);
  height = tcu::Vector<int,_2>::y(renderSize);
  scissor.offset = (VkOffset2D)::vk::makeExtent2D(width,height);
  pipelineRasterizationStateInfo.lineWidth = 3.08286e-44;
  pipelineViewportStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineViewportStateInfo._4_4_ = 0;
  pipelineViewportStateInfo.pNext._0_4_ = 0;
  pipelineViewportStateInfo.pNext._4_4_ = 1;
  pipelineViewportStateInfo._16_8_ = &scissor.extent;
  pipelineViewportStateInfo.pViewports._0_4_ = 1;
  pipelineViewportStateInfo._32_8_ = &pipelineViewportStateInfo.pScissors;
  memset(&pipelineMultisampleStateInfo.alphaToCoverageEnable,0,0x40);
  pipelineMultisampleStateInfo.alphaToCoverageEnable = 0x17;
  pipelineRasterizationStateInfo.depthBiasClamp = 1.0;
  memset(&stencilOpState.writeMask,0,0x30);
  stencilOpState.writeMask = 0x18;
  pipelineMultisampleStateInfo.pNext._4_4_ = 1;
  ::vk::makeStencilOpState
            ((VkStencilOpState *)&pipelineDepthStencilStateInfo.maxDepthBounds,VK_STENCIL_OP_KEEP,
             VK_STENCIL_OP_ZERO,VK_STENCIL_OP_KEEP,VK_COMPARE_OP_EQUAL,0xffffffff,0xffffffff,0x2a);
  pipelineColorBlendAttachmentState.colorWriteMask = 0x19;
  pipelineDepthStencilStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineDepthStencilStateInfo._4_4_ = 0;
  pipelineDepthStencilStateInfo.pNext._0_4_ = 0;
  pipelineDepthStencilStateInfo.pNext._4_4_ = (uint)(vertexInputBindingDescription.stride._3_1_ & 1)
  ;
  pipelineDepthStencilStateInfo.flags = 0;
  pipelineDepthStencilStateInfo.depthTestEnable = 1;
  pipelineDepthStencilStateInfo.depthWriteEnable = 0;
  pipelineDepthStencilStateInfo.depthCompareOp =
       (VkCompareOp)(vertexInputBindingDescription.stride._2_1_ & 1);
  pipelineDepthStencilStateInfo.depthBoundsTestEnable =
       (VkBool32)pipelineDepthStencilStateInfo.maxDepthBounds;
  pipelineDepthStencilStateInfo.stencilTestEnable = dStack_1b8;
  pipelineDepthStencilStateInfo.front.failOp = stencilOpState.failOp;
  pipelineDepthStencilStateInfo.front.passOp = stencilOpState.passOp;
  pipelineDepthStencilStateInfo.front.depthFailOp = stencilOpState.depthFailOp;
  pipelineDepthStencilStateInfo.front.compareOp = stencilOpState.compareOp;
  pipelineDepthStencilStateInfo.front.compareMask = stencilOpState.compareMask;
  pipelineDepthStencilStateInfo.front.writeMask =
       (deUint32)pipelineDepthStencilStateInfo.maxDepthBounds;
  pipelineDepthStencilStateInfo.front.reference = dStack_1b8;
  pipelineDepthStencilStateInfo.back.failOp = stencilOpState.failOp;
  pipelineDepthStencilStateInfo.back.passOp = stencilOpState.passOp;
  pipelineDepthStencilStateInfo.back.depthFailOp = stencilOpState.depthFailOp;
  pipelineDepthStencilStateInfo.back.compareOp = stencilOpState.compareOp;
  pipelineDepthStencilStateInfo.back.compareMask = stencilOpState.compareMask;
  pipelineDepthStencilStateInfo.back.writeMask = 0;
  pipelineDepthStencilStateInfo.back.reference = 0x3f800000;
  pipelineColorBlendAttachmentState.alphaBlendOp = 0xf;
  stack0xfffffffffffffdb4 = 0x100000000;
  pipelineColorBlendAttachmentState.blendEnable = 0;
  pipelineColorBlendAttachmentState.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.dstColorBlendFactor = VK_BLEND_FACTOR_ONE;
  pipelineColorBlendAttachmentState.colorBlendOp = VK_BLEND_OP_ADD;
  pipelineColorBlendAttachmentState.srcAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.dstAlphaBlendFactor = VK_BLEND_FACTOR_SRC1_COLOR;
  pShaderStages[1].pSpecializationInfo._0_4_ = 0x1a;
  pipelineColorBlendStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineColorBlendStateInfo._4_4_ = 0;
  pipelineColorBlendStateInfo.pNext._0_4_ = 0;
  pipelineColorBlendStateInfo.pNext._4_4_ = 0;
  pipelineColorBlendStateInfo.flags = 3;
  pipelineColorBlendStateInfo.logicOpEnable = 1;
  pipelineColorBlendStateInfo._24_8_ = pipelineColorBlendStateInfo.blendConstants + 3;
  pipelineColorBlendStateInfo.pAttachments._0_4_ = 0;
  pipelineColorBlendStateInfo.pAttachments._4_4_ = 0;
  pipelineColorBlendStateInfo.blendConstants[0] = 0.0;
  pipelineColorBlendStateInfo.blendConstants[1] = 0.0;
  local_2e8 = 0x12;
  pShaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pShaderStages[0]._4_4_ = 0;
  pShaderStages[0].pNext._0_4_ = 0;
  pShaderStages[0].pNext._4_4_ = 1;
  pShaderStages[0]._16_8_ = vertexModule.m_internal;
  pShaderStages[0].module.m_internal = (long)"pre_main" + 4;
  pShaderStages[0].pName = (char *)0x0;
  pShaderStages[0].pSpecializationInfo._0_4_ = 0x12;
  pShaderStages[1].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pShaderStages[1]._4_4_ = 0;
  pShaderStages[1].pNext._0_4_ = 0;
  pShaderStages[1].pNext._4_4_ = 0x10;
  pShaderStages[1]._16_8_ = fragmentModule.m_internal;
  pShaderStages[1].module.m_internal = (long)"pre_main" + 4;
  pShaderStages[1].pName = (char *)0x0;
  ::vk::Handle<(vk::HandleType)18>::Handle
            ((Handle<(vk::HandleType)18> *)&graphicsPipelineInfo.basePipelineIndex,0);
  bVar1 = ::vk::Handle<(vk::HandleType)18>::operator==
                    ((Handle<(vk::HandleType)18> *)&pipelineLayout_local,
                     (Handle<(vk::HandleType)18> *)&graphicsPipelineInfo.basePipelineIndex);
  device_00 = stack0xffffffffffffffb0;
  graphicsPipelineInfo.pNext._0_4_ = 4;
  if (bVar1) {
    graphicsPipelineInfo.pNext._0_4_ = 2;
  }
  local_388._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  graphicsPipelineInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  graphicsPipelineInfo._4_4_ = 0;
  graphicsPipelineInfo.pNext._4_4_ = 2;
  graphicsPipelineInfo._16_8_ = &local_2e8;
  graphicsPipelineInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)&pipelineInputAssemblyStateInfo.primitiveRestartEnable;
  graphicsPipelineInfo.pVertexInputState =
       (VkPipelineVertexInputStateCreateInfo *)&viewport.minDepth;
  graphicsPipelineInfo.pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  graphicsPipelineInfo.pTessellationState =
       (VkPipelineTessellationStateCreateInfo *)&pipelineRasterizationStateInfo.lineWidth;
  graphicsPipelineInfo.pViewportState =
       (VkPipelineViewportStateCreateInfo *)&pipelineMultisampleStateInfo.alphaToCoverageEnable;
  graphicsPipelineInfo.pRasterizationState =
       (VkPipelineRasterizationStateCreateInfo *)&stencilOpState.writeMask;
  graphicsPipelineInfo.pMultisampleState =
       (VkPipelineMultisampleStateCreateInfo *)&pipelineColorBlendAttachmentState.colorWriteMask;
  graphicsPipelineInfo.pDepthStencilState =
       (VkPipelineDepthStencilStateCreateInfo *)&pShaderStages[1].pSpecializationInfo;
  graphicsPipelineInfo.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)0x0;
  graphicsPipelineInfo.renderPass.m_internal._0_4_ = subpass;
  graphicsPipelineInfo._120_8_ = pipelineLayout_local.m_internal;
  graphicsPipelineInfo.basePipelineHandle.m_internal._0_4_ = 0xffffffff;
  graphicsPipelineInfo.pDynamicState = (VkPipelineDynamicStateCreateInfo *)pipelineLayout.m_internal
  ;
  graphicsPipelineInfo.layout.m_internal = renderPass.m_internal;
  ::vk::Handle<(vk::HandleType)15>::Handle(&local_390,0);
  ::vk::createGraphicsPipeline
            (__return_storage_ptr__,vk,device_00,local_390,(VkGraphicsPipelineCreateInfo *)local_388
             ,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> makeGraphicsPipeline (const DeviceInterface&		vk,
									   const VkDevice				device,
									   const VkPipeline				basePipeline,		// for derivatives
									   const VkPipelineLayout		pipelineLayout,
									   const VkRenderPass			renderPass,
									   const VkShaderModule			vertexModule,
									   const VkShaderModule			fragmentModule,
									   const IVec2&					renderSize,
									   const VkPrimitiveTopology	topology,
									   const deUint32				subpass,
									   const bool					useDepth,
									   const bool					useStencil)
{
	const VkVertexInputBindingDescription vertexInputBindingDescription =
	{
		0u,								// uint32_t				binding;
		sizeof(Vertex4RGBA),			// uint32_t				stride;
		VK_VERTEX_INPUT_RATE_VERTEX,	// VkVertexInputRate	inputRate;
	};

	const VkVertexInputAttributeDescription vertexInputAttributeDescriptions[] =
	{
		{
			0u,								// uint32_t			location;
			0u,								// uint32_t			binding;
			VK_FORMAT_R32G32B32A32_SFLOAT,	// VkFormat			format;
			0u,								// uint32_t			offset;
		},
		{
			1u,								// uint32_t			location;
			0u,								// uint32_t			binding;
			VK_FORMAT_R32G32B32A32_SFLOAT,	// VkFormat			format;
			sizeof(Vec4),					// uint32_t			offset;
		}
	};

	const VkPipelineVertexInputStateCreateInfo vertexInputStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineVertexInputStateCreateFlags)0,					// VkPipelineVertexInputStateCreateFlags	flags;
		1u,															// uint32_t									vertexBindingDescriptionCount;
		&vertexInputBindingDescription,								// const VkVertexInputBindingDescription*	pVertexBindingDescriptions;
		DE_LENGTH_OF_ARRAY(vertexInputAttributeDescriptions),		// uint32_t									vertexAttributeDescriptionCount;
		vertexInputAttributeDescriptions,							// const VkVertexInputAttributeDescription*	pVertexAttributeDescriptions;
	};

	const VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,														// const void*								pNext;
		(VkPipelineInputAssemblyStateCreateFlags)0,						// VkPipelineInputAssemblyStateCreateFlags	flags;
		topology,														// VkPrimitiveTopology						topology;
		VK_FALSE,														// VkBool32									primitiveRestartEnable;
	};

	const VkViewport viewport = makeViewport(
		0.0f, 0.0f,
		static_cast<float>(renderSize.x()), static_cast<float>(renderSize.y()),
		0.0f, 1.0f);

	const VkRect2D scissor =
	{
		makeOffset2D(0, 0),
		makeExtent2D(renderSize.x(), renderSize.y()),
	};

	const VkPipelineViewportStateCreateInfo pipelineViewportStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,	// VkStructureType						sType;
		DE_NULL,												// const void*							pNext;
		(VkPipelineViewportStateCreateFlags)0,					// VkPipelineViewportStateCreateFlags	flags;
		1u,														// uint32_t								viewportCount;
		&viewport,												// const VkViewport*					pViewports;
		1u,														// uint32_t								scissorCount;
		&scissor,												// const VkRect2D*						pScissors;
	};

	const VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineRasterizationStateCreateFlags)0,					// VkPipelineRasterizationStateCreateFlags	flags;
		VK_FALSE,													// VkBool32									depthClampEnable;
		VK_FALSE,													// VkBool32									rasterizerDiscardEnable;
		VK_POLYGON_MODE_FILL,										// VkPolygonMode							polygonMode;
		VK_CULL_MODE_NONE,											// VkCullModeFlags							cullMode;
		VK_FRONT_FACE_COUNTER_CLOCKWISE,							// VkFrontFace								frontFace;
		VK_FALSE,													// VkBool32									depthBiasEnable;
		0.0f,														// float									depthBiasConstantFactor;
		0.0f,														// float									depthBiasClamp;
		0.0f,														// float									depthBiasSlopeFactor;
		1.0f,														// float									lineWidth;
	};

	const VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineMultisampleStateCreateFlags)0,					// VkPipelineMultisampleStateCreateFlags	flags;
		VK_SAMPLE_COUNT_1_BIT,										// VkSampleCountFlagBits					rasterizationSamples;
		VK_FALSE,													// VkBool32									sampleShadingEnable;
		0.0f,														// float									minSampleShading;
		DE_NULL,													// const VkSampleMask*						pSampleMask;
		VK_FALSE,													// VkBool32									alphaToCoverageEnable;
		VK_FALSE													// VkBool32									alphaToOneEnable;
	};

	const VkStencilOpState stencilOpState = makeStencilOpState(
		VK_STENCIL_OP_KEEP,									// stencil fail
		VK_STENCIL_OP_ZERO,									// depth & stencil pass
		VK_STENCIL_OP_KEEP,									// depth only fail
		VK_COMPARE_OP_EQUAL,								// compare op
		~0u,												// compare mask
		~0u,												// write mask
		static_cast<deUint32>(REFERENCE_STENCIL_VALUE));	// reference

	VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineDepthStencilStateCreateFlags)0,					// VkPipelineDepthStencilStateCreateFlags	flags;
		useDepth,													// VkBool32									depthTestEnable;
		VK_FALSE,													// VkBool32									depthWriteEnable;
		VK_COMPARE_OP_LESS,											// VkCompareOp								depthCompareOp;
		VK_FALSE,													// VkBool32									depthBoundsTestEnable;
		useStencil,													// VkBool32									stencilTestEnable;
		stencilOpState,												// VkStencilOpState							front;
		stencilOpState,												// VkStencilOpState							back;
		0.0f,														// float									minDepthBounds;
		1.0f,														// float									maxDepthBounds;
	};

	const VkColorComponentFlags colorComponentsAll = VK_COLOR_COMPONENT_R_BIT | VK_COLOR_COMPONENT_G_BIT | VK_COLOR_COMPONENT_B_BIT | VK_COLOR_COMPONENT_A_BIT;
	// Number of blend attachments must equal the number of color attachments during any subpass.
	const VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState =
	{
		VK_FALSE,				// VkBool32					blendEnable;
		VK_BLEND_FACTOR_ONE,	// VkBlendFactor			srcColorBlendFactor;
		VK_BLEND_FACTOR_ZERO,	// VkBlendFactor			dstColorBlendFactor;
		VK_BLEND_OP_ADD,		// VkBlendOp				colorBlendOp;
		VK_BLEND_FACTOR_ONE,	// VkBlendFactor			srcAlphaBlendFactor;
		VK_BLEND_FACTOR_ZERO,	// VkBlendFactor			dstAlphaBlendFactor;
		VK_BLEND_OP_ADD,		// VkBlendOp				alphaBlendOp;
		colorComponentsAll,		// VkColorComponentFlags	colorWriteMask;
	};

	const VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,	// VkStructureType								sType;
		DE_NULL,													// const void*									pNext;
		(VkPipelineColorBlendStateCreateFlags)0,					// VkPipelineColorBlendStateCreateFlags			flags;
		VK_FALSE,													// VkBool32										logicOpEnable;
		VK_LOGIC_OP_COPY,											// VkLogicOp									logicOp;
		1u,															// deUint32										attachmentCount;
		&pipelineColorBlendAttachmentState,							// const VkPipelineColorBlendAttachmentState*	pAttachments;
		{ 0.0f, 0.0f, 0.0f, 0.0f },									// float										blendConstants[4];
	};

	const VkPipelineShaderStageCreateInfo pShaderStages[] =
	{
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
			DE_NULL,												// const void*							pNext;
			(VkPipelineShaderStageCreateFlags)0,					// VkPipelineShaderStageCreateFlags		flags;
			VK_SHADER_STAGE_VERTEX_BIT,								// VkShaderStageFlagBits				stage;
			vertexModule,											// VkShaderModule						module;
			"main",													// const char*							pName;
			DE_NULL,												// const VkSpecializationInfo*			pSpecializationInfo;
		},
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
			DE_NULL,												// const void*							pNext;
			(VkPipelineShaderStageCreateFlags)0,					// VkPipelineShaderStageCreateFlags		flags;
			VK_SHADER_STAGE_FRAGMENT_BIT,							// VkShaderStageFlagBits				stage;
			fragmentModule,											// VkShaderModule						module;
			"main",													// const char*							pName;
			DE_NULL,												// const VkSpecializationInfo*			pSpecializationInfo;
		}
	};

	const VkPipelineCreateFlags			flags = (basePipeline == DE_NULL ? VK_PIPELINE_CREATE_ALLOW_DERIVATIVES_BIT
																		 : VK_PIPELINE_CREATE_DERIVATIVE_BIT);

	const VkGraphicsPipelineCreateInfo	graphicsPipelineInfo =
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,	// VkStructureType									sType;
		DE_NULL,											// const void*										pNext;
		flags,												// VkPipelineCreateFlags							flags;
		DE_LENGTH_OF_ARRAY(pShaderStages),					// deUint32											stageCount;
		pShaderStages,										// const VkPipelineShaderStageCreateInfo*			pStages;
		&vertexInputStateInfo,								// const VkPipelineVertexInputStateCreateInfo*		pVertexInputState;
		&pipelineInputAssemblyStateInfo,					// const VkPipelineInputAssemblyStateCreateInfo*	pInputAssemblyState;
		DE_NULL,											// const VkPipelineTessellationStateCreateInfo*		pTessellationState;
		&pipelineViewportStateInfo,							// const VkPipelineViewportStateCreateInfo*			pViewportState;
		&pipelineRasterizationStateInfo,					// const VkPipelineRasterizationStateCreateInfo*	pRasterizationState;
		&pipelineMultisampleStateInfo,						// const VkPipelineMultisampleStateCreateInfo*		pMultisampleState;
		&pipelineDepthStencilStateInfo,						// const VkPipelineDepthStencilStateCreateInfo*		pDepthStencilState;
		&pipelineColorBlendStateInfo,						// const VkPipelineColorBlendStateCreateInfo*		pColorBlendState;
		DE_NULL,											// const VkPipelineDynamicStateCreateInfo*			pDynamicState;
		pipelineLayout,										// VkPipelineLayout									layout;
		renderPass,											// VkRenderPass										renderPass;
		subpass,											// deUint32											subpass;
		basePipeline,										// VkPipeline										basePipelineHandle;
		-1,													// deInt32											basePipelineIndex;
	};

	return createGraphicsPipeline(vk, device, DE_NULL, &graphicsPipelineInfo);
}